

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jaeger_types.cpp
# Opt level: O1

ssize_t __thiscall
jaegertracing::thrift::SpanRef::read(SpanRef *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined8 *puVar5;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  int16_t fid;
  int32_t ecast11;
  TType ftype;
  string fname;
  ushort local_8a;
  uint local_88;
  uint local_84;
  uint local_80;
  uint local_7c;
  type local_78;
  int local_74;
  SpanRef *local_70;
  int64_t *local_68;
  int64_t *local_60;
  int64_t *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  apache::thrift::protocol::TProtocol::incrementInputRecursionDepth(this_00);
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  iVar1 = (*this_00->_vptr_TProtocol[0x19])(this_00,&local_50);
  local_58 = &this->spanId;
  local_60 = &this->traceIdHigh;
  local_68 = &this->traceIdLow;
  local_7c = 0;
  local_80 = 0;
  local_84 = 0;
  local_88 = 0;
  local_70 = this;
  do {
    iVar2 = (*this_00->_vptr_TProtocol[0x1b])(this_00,&local_50,&local_74,&local_8a);
    if (local_74 == 0) {
      iVar3 = (*this_00->_vptr_TProtocol[0x1a])(this_00);
      if (((((local_7c & 1) != 0) && ((local_80 & 1) != 0)) && ((local_84 & 1) != 0)) &&
         ((local_88 & 1) != 0)) {
        if (local_50 != local_40) {
          operator_delete(local_50);
        }
        this_00->input_recursion_depth_ = this_00->input_recursion_depth_ - 1;
        return (ulong)(uint)(iVar3 + iVar2 + iVar1);
      }
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x30);
      puVar5[1] = puVar5 + 3;
      puVar5[2] = 0;
      *(undefined1 *)(puVar5 + 3) = 0;
      *puVar5 = &PTR__TException_002766f0;
      *(undefined4 *)(puVar5 + 5) = 1;
      __cxa_throw(puVar5,&apache::thrift::protocol::TProtocolException::typeinfo,
                  apache::thrift::TException::~TException);
    }
    switch(local_8a) {
    case 1:
      if (local_74 != 8) break;
      iVar3 = (*this_00->_vptr_TProtocol[0x27])(this_00,&local_78);
      local_70->refType = local_78;
      local_7c = (uint)CONCAT71((uint7)(uint3)(local_78 >> 8),1);
      goto LAB_002104f7;
    case 2:
      if (local_74 == 10) {
        iVar3 = (*this_00->_vptr_TProtocol[0x28])(this_00,local_68);
        local_80 = (uint)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
        goto LAB_002104f7;
      }
      break;
    case 3:
      if (local_74 == 10) {
        iVar3 = (*this_00->_vptr_TProtocol[0x28])(this_00,local_60);
        local_84 = (uint)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
        goto LAB_002104f7;
      }
      break;
    case 4:
      if (local_74 == 10) {
        iVar3 = (*this_00->_vptr_TProtocol[0x28])(this_00,local_58);
        local_88 = (uint)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
        goto LAB_002104f7;
      }
    }
    iVar3 = (*this_00->_vptr_TProtocol[0x2c])(this_00);
LAB_002104f7:
    iVar4 = (*this_00->_vptr_TProtocol[0x1c])(this_00);
    iVar1 = iVar3 + iVar2 + iVar1 + iVar4;
  } while( true );
}

Assistant:

uint32_t SpanRef::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;

  bool isset_refType = false;
  bool isset_traceIdLow = false;
  bool isset_traceIdHigh = false;
  bool isset_spanId = false;

  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          int32_t ecast11;
          xfer += iprot->readI32(ecast11);
          this->refType = (SpanRefType::type)ecast11;
          isset_refType = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 2:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->traceIdLow);
          isset_traceIdLow = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 3:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->traceIdHigh);
          isset_traceIdHigh = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 4:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->spanId);
          isset_spanId = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  if (!isset_refType)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_traceIdLow)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_traceIdHigh)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_spanId)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  return xfer;
}